

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_3_4::loadDeepImage(string *fileName,Header *hdr,DeepImage *img)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  string *in_RDI;
  MultiPartInputFile mpi;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  bool multiPart;
  bool deep;
  bool tiled;
  string *in_stack_fffffffffffffa90;
  byte local_549;
  MultiPartInputFile local_4e8 [32];
  stringstream local_4c8 [16];
  ostream local_4b8 [184];
  DeepImage *in_stack_fffffffffffffc00;
  Header *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  stringstream local_340 [16];
  ostream local_330 [112];
  DeepImage *in_stack_fffffffffffffd40;
  Header *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  stringstream local_1a8 [16];
  ostream local_198 [381];
  bool local_1b;
  bool local_1a;
  bool local_19 [17];
  string *local_8;
  
  local_8 = in_RDI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  uVar4 = Imf_3_4::isOpenExrFile(pcVar3,local_19,&local_1a,&local_1b);
  if ((uVar4 & 1) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar5 = std::operator<<(local_198,"Cannot load image file ");
    poVar5 = std::operator<<(poVar5,local_8);
    std::operator<<(poVar5,".  The file is not an OpenEXR file.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_1a8);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if ((local_1b & 1U) == 0) {
    if ((local_1a & 1U) != 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_4e8,pcVar3,iVar2,true);
      iVar2 = Imf_3_4::MultiPartInputFile::parts();
      local_549 = 0;
      if (0 < iVar2) {
        Imf_3_4::MultiPartInputFile::header((int)local_4e8);
        bVar1 = Imf_3_4::Header::hasType();
        local_549 = 0;
        if ((bVar1 & 1) != 0) {
          Imf_3_4::MultiPartInputFile::header((int)local_4e8);
          in_stack_fffffffffffffa90 = (string *)Imf_3_4::Header::type_abi_cxx11_();
          local_549 = Imf_3_4::isTiled(in_stack_fffffffffffffa90);
        }
      }
      local_19[0] = (bool)(local_549 & 1);
      MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)in_stack_fffffffffffffa90);
      if ((local_19[0] & 1U) == 0) {
        loadDeepScanLineImage
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      }
      else {
        loadDeepTiledImage(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           in_stack_fffffffffffffc00);
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4c8);
    poVar5 = std::operator<<(local_4b8,"Cannot load flat image file ");
    poVar5 = std::operator<<(poVar5,local_8);
    std::operator<<(poVar5," as a deep image.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_4c8);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_340);
  poVar5 = std::operator<<(local_330,"Cannot load image file ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::operator<<(poVar5,".  Multi-part file loading is not supported.");
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar6,local_340);
  __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
loadDeepImage (const string& fileName, Header& hdr, DeepImage& img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str (), tiled, deep, multiPart))
    {
        THROW (
            ArgExc,
            "Cannot load image file " << fileName
                                      << ".  "
                                         "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (
            ArgExc,
            "Cannot load image file "
                << fileName
                << ".  "
                   "Multi-part file loading is not supported.");
    }

    if (!deep)
    {
        THROW (
            ArgExc,
            "Cannot load flat image file " << fileName
                                           << " "
                                              "as a deep image.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the OpenEXR library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str ());

        tiled =
            (mpi.parts () > 0 && mpi.header (0).hasType () &&
             isTiled (mpi.header (0).type ()));
    }

    if (tiled)
        loadDeepTiledImage (fileName, hdr, img);
    else
        loadDeepScanLineImage (fileName, hdr, img);
}